

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.h
# Opt level: O2

int32_t icu_63::Hangul::decompose(UChar32 c,UChar *buffer)

{
  ulong uVar1;
  long lVar2;
  int iVar3;
  
  iVar3 = c + -0xac00;
  uVar1 = (long)iVar3 / 0x1c;
  lVar2 = (long)iVar3 % 0x1c;
  *buffer = (short)(iVar3 / 0x24c) + L'ᄀ';
  buffer[1] = (short)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) % 0x15)
              + L'ᅡ';
  if ((int)lVar2 != 0) {
    buffer[2] = (short)lVar2 + L'ᆧ';
    return 3;
  }
  return 2;
}

Assistant:

static inline int32_t decompose(UChar32 c, UChar buffer[3]) {
        c-=HANGUL_BASE;
        UChar32 c2=c%JAMO_T_COUNT;
        c/=JAMO_T_COUNT;
        buffer[0]=(UChar)(JAMO_L_BASE+c/JAMO_V_COUNT);
        buffer[1]=(UChar)(JAMO_V_BASE+c%JAMO_V_COUNT);
        if(c2==0) {
            return 2;
        } else {
            buffer[2]=(UChar)(JAMO_T_BASE+c2);
            return 3;
        }
    }